

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges
               (uint unset_nbr1_index,uint count,ON_SubDVertex *v,ON_SubDEdgePtrLink *links)

{
  bool bVar1;
  ON_SubDEdge *this;
  ON_SubDEdge *pOVar2;
  ON_SubDFace *pOVar3;
  uint local_134;
  uint uStack_130;
  ON_2udex pair;
  uint pair_count;
  ON_2udex pairs [2];
  uint local_10c;
  uint j_2;
  ON_SubDFace *edge_faces [4] [2];
  uint local_bc;
  uint local_b8;
  uint k;
  uint j_1;
  uint match_count;
  ON_SubDEdge *ve;
  ON_SubDEdge *e;
  uint local_98;
  uint j;
  uint crease_edge_link_index [4];
  uint smooth_edge_link_index [4];
  uint local_70;
  uint local_6c;
  uint smooth_edge_count;
  uint crease_edge_count;
  ON_SubDEdge *vertex_edges [4];
  ON_SubDEdge *link_edges [4];
  ON_SubDEdgePtrLink *links_local;
  ON_SubDVertex *v_local;
  uint count_local;
  uint unset_nbr1_index_local;
  
  if (count < 3) {
    return;
  }
  if (v == (ON_SubDVertex *)0x0) {
    return;
  }
  if (count != v->m_edge_count) {
    return;
  }
  if (count == 3) {
    bVar1 = ON_SubDVertex::IsCrease(v);
    if (bVar1) goto LAB_008ae791;
    bVar1 = ON_SubDVertex::IsDart(v);
  }
  else if (count == 4) {
    bVar1 = ON_SubDVertex::IsCrease(v);
    if (bVar1) goto LAB_008ae791;
    bVar1 = ON_SubDVertex::IsSmooth(v);
  }
  else {
    bVar1 = ON_SubDVertex::IsCrease(v);
  }
  if (!bVar1) {
    return;
  }
LAB_008ae791:
  memset(vertex_edges + 3,0,0x20);
  memset(&smooth_edge_count,0,0x20);
  local_6c = 0;
  local_70 = 0;
  memset(crease_edge_link_index + 2,0,0x10);
  memset(&local_98,0,0x10);
  for (e._4_4_ = 0; e._4_4_ < count; e._4_4_ = e._4_4_ + 1) {
    this = ON_SubDEdgePtr::Edge(&links[e._4_4_].m_ep);
    if (this == (ON_SubDEdge *)0x0) {
      return;
    }
    pOVar2 = ON_SubDVertex::Edge(v,e._4_4_);
    if (pOVar2 == (ON_SubDEdge *)0x0) {
      return;
    }
    if (e._4_4_ < 4) {
      vertex_edges[(ulong)e._4_4_ + 3] = this;
      *(ON_SubDEdge **)(&smooth_edge_count + (ulong)e._4_4_ * 2) = pOVar2;
    }
    bVar1 = ON_SubDEdge::IsSmooth(this);
    if ((bVar1) && (this->m_face_count == 2)) {
      if (local_70 < 4) {
        crease_edge_link_index[(ulong)local_70 + 2] = e._4_4_;
      }
      local_70 = local_70 + 1;
    }
    else {
      bVar1 = ON_SubDEdge::IsCrease(this);
      if (!bVar1) {
        return;
      }
      if (local_6c < 4) {
        (&local_98)[local_6c] = e._4_4_;
      }
      local_6c = local_6c + 1;
    }
  }
  if ((local_6c == 2) && (bVar1 = ON_SubDVertex::IsCrease(v), bVar1)) {
    links[local_98].m_nbr_index = links[j].m_index;
    links[j].m_nbr_index = links[local_98].m_index;
    if (local_70 == 1) {
      links[crease_edge_link_index[2]].m_nbr_index = unset_nbr1_index;
    }
  }
  if (local_70 == 2) {
    links[crease_edge_link_index[2]].m_nbr_index = links[crease_edge_link_index[3]].m_index;
    links[crease_edge_link_index[3]].m_nbr_index = links[crease_edge_link_index[2]].m_index;
    if (local_6c == 1) {
      links[local_98].m_nbr_index = unset_nbr1_index;
    }
  }
  if (((((count == 4) && (local_70 == 4)) && (local_6c == 0)) &&
      ((v->m_face_count == 4 && (v->m_edge_count == 4)))) &&
     (bVar1 = ON_SubDVertex::IsSmooth(v), bVar1)) {
    k = 0;
    for (local_b8 = 0; local_b8 == k && local_b8 < 4; local_b8 = local_b8 + 1) {
      for (local_bc = 0; local_bc < 4; local_bc = local_bc + 1) {
        if (*(ON_SubDEdge **)(&smooth_edge_count + (ulong)local_bc * 2) ==
            vertex_edges[(ulong)local_b8 + 3]) {
          (&smooth_edge_count + (ulong)local_bc * 2)[0] = 0;
          (&smooth_edge_count + (ulong)local_bc * 2)[1] = 0;
          k = k + 1;
          break;
        }
      }
    }
    if (k == 4) {
      for (local_10c = 0; local_10c < 4; local_10c = local_10c + 1) {
        pOVar3 = ON_SubDEdge::Face(vertex_edges[(ulong)local_10c + 3],0);
        edge_faces[(ulong)local_10c - 1][1] = pOVar3;
        pOVar3 = ON_SubDEdge::Face(vertex_edges[(ulong)local_10c + 3],1);
        edge_faces[local_10c][0] = pOVar3;
        if (edge_faces[(ulong)local_10c - 1][1] == (ON_SubDFace *)0x0) {
          return;
        }
        if (edge_faces[local_10c][0] == (ON_SubDFace *)0x0) {
          return;
        }
      }
      pair.i = 0;
      for (local_134 = 0; uStack_130 = local_134, local_134 < 4; local_134 = local_134 + 1) {
        do {
          do {
            uStack_130 = uStack_130 + 1;
            if (3 < uStack_130) goto LAB_008aed5b;
          } while (((edge_faces[(ulong)local_134 - 1][1] == edge_faces[(ulong)uStack_130 - 1][1]) ||
                   (edge_faces[(ulong)local_134 - 1][1] == edge_faces[uStack_130][0])) ||
                  ((edge_faces[local_134][0] == edge_faces[(ulong)uStack_130 - 1][1] ||
                   (edge_faces[local_134][0] == edge_faces[uStack_130][0]))));
          if (pair.i < 2) {
            *(ulong *)&(&pair)[pair.i].j = CONCAT44(uStack_130,local_134);
          }
          pair.i = pair.i + 1;
        } while (pair.i < 3);
LAB_008aed5b:
      }
      if (pair.i == 2) {
        links[pair.j].m_nbr_index = links[pair_count].m_index;
        links[pair_count].m_nbr_index = links[pair.j].m_index;
        links[pairs[0].i].m_nbr_index = links[pairs[0].j].m_index;
        links[pairs[0].j].m_nbr_index = links[pairs[0].i].m_index;
      }
    }
  }
  return;
}

Assistant:

void ON_SubDEdgePtrLink::Resolve3OrMoreEdges(
  const unsigned int unset_nbr1_index,
  unsigned int count,
  const ON_SubDVertex* v,
  ON_SubDEdgePtrLink* links
)
{
  // If the case can't be resolved by Resolve3OrMoreEdges(), 
  // then the vertex will not appear in the middle of a chain.

  if (count < 3 || nullptr == v || count != (unsigned int)v->m_edge_count)
    return;

  switch (count)
  {
  case 3:
    if (false == v->IsCrease() && false == v->IsDart())
      return;
    break;

  case 4:
    if (false == v->IsCrease() && false == v->IsSmooth())
      return;
    break;

  default:
    if (false == v->IsCrease())
      return;
    break;
  }

  const ON_SubDEdge* link_edges[4] = {};
  const ON_SubDEdge* vertex_edges[4] = {};
  unsigned int crease_edge_count = 0;
  unsigned int smooth_edge_count = 0;
  unsigned int smooth_edge_link_index[4] = {};
  unsigned int crease_edge_link_index[4] = {};
  for (unsigned int j = 0; j < count; j++)
  {
    const ON_SubDEdge* e = links[j].m_ep.Edge();
    if (nullptr == e)
      return;
    const ON_SubDEdge* ve = v->Edge(j);
    if (nullptr == ve)
      return;
    if (j < 4)
    {
      link_edges[j] = e;
      vertex_edges[j] = ve;
    }

    if (e->IsSmooth() && 2 == e->m_face_count)
    {
      if ( smooth_edge_count < 4)
        smooth_edge_link_index[smooth_edge_count] = j;
      ++smooth_edge_count;
    }
    else if (e->IsCrease())
    {
      if (crease_edge_count < 4)
        crease_edge_link_index[crease_edge_count] = j;
      ++crease_edge_count;
    }
    else
      return;
  }

  if ( 2 == crease_edge_count && v->IsCrease() )
  {
    // Link the two creased edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[crease_edge_link_index[0]].m_nbr_index = links[crease_edge_link_index[1]].m_index;
    links[crease_edge_link_index[1]].m_nbr_index = links[crease_edge_link_index[0]].m_index;
    if (1 == smooth_edge_count)
    {
      // this edge will be at the end of a chain.
      links[smooth_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
  }

  if (2 == smooth_edge_count)
  {
    // Link the two smooth edges.
    // The vertex will be interior in a chain and the edges
    // will be next to each other.
    links[smooth_edge_link_index[0]].m_nbr_index = links[smooth_edge_link_index[1]].m_index;
    links[smooth_edge_link_index[1]].m_nbr_index = links[smooth_edge_link_index[0]].m_index;
    if (1 == crease_edge_count)
    {
      // this edge will be at the end of a chain
      links[crease_edge_link_index[0]].m_nbr_index = unset_nbr1_index;
    }
   }

  if (
    4 != count
    || 4 != smooth_edge_count
    || 0 != crease_edge_count
    || 4 != v->m_face_count
    || 4 != v->m_edge_count
    || false == v->IsSmooth()
    )
    return;

  // make sure vertex_edges[] and link_edges[] are the same list.
  unsigned int match_count = 0;
  for (unsigned int j = 0; j == match_count && j < count; j++)
  {
    for (unsigned int k = 0; k < count; k++)
    {
      if (vertex_edges[k] == link_edges[j])
      {
        vertex_edges[k] = nullptr;
        match_count++;
        break;
      }
    }
  }
  if (match_count != count)
    return;
  
  // vertex has 4 faces and 4 smooth edges. Link opposite edges.
  const ON_SubDFace* edge_faces[4][2];
  for (unsigned int j = 0; j < 4; j++)
  {
    edge_faces[j][0] = link_edges[j]->Face(0);
    edge_faces[j][1] = link_edges[j]->Face(1);
    if (nullptr == edge_faces[j][0] || nullptr == edge_faces[j][1])
      return;
  }
  ON_2udex pairs[2];
  unsigned int pair_count = 0;
  ON_2udex pair;
  for (pair.i = 0; pair.i < 4; ++pair.i) for (pair.j = pair.i+1; pair.j < 4; ++pair.j)
  {
    if (
      edge_faces[pair.i][0] != edge_faces[pair.j][0]
      && edge_faces[pair.i][0] != edge_faces[pair.j][1]
      && edge_faces[pair.i][1] != edge_faces[pair.j][0]
      && edge_faces[pair.i][1] != edge_faces[pair.j][1]
      )
    {
      // the associated edges share no faces.
      if ( pair_count < 2)
        pairs[pair_count] = pair;
      if (++pair_count > 2)
        break;
    }
  }
  if (2 == pair_count)
  {
    links[pairs[0].i].m_nbr_index = links[pairs[0].j].m_index;
    links[pairs[0].j].m_nbr_index = links[pairs[0].i].m_index;
    links[pairs[1].i].m_nbr_index = links[pairs[1].j].m_index;
    links[pairs[1].j].m_nbr_index = links[pairs[1].i].m_index;
  }

  return;
}